

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O2

void __thiscall
QPDF::updateObjectMaps
          (QPDF *this,ObjUser *first_ou,QPDFObjectHandle *first_oh,
          function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  _Rb_tree_node_base *__lhs;
  pointer pUVar1;
  __uniq_ptr_impl<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> __args;
  element_type *__p;
  bool bVar2;
  bool bVar3;
  int iVar4;
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  *this_00;
  _Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
  *this_01;
  iterator __args_1;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  QPDFObjectHandle *item;
  QPDFObjectHandle *this_02;
  value_type cur;
  unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> thumb_ou;
  vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_> pending;
  QPDFObjGen og;
  set visited;
  uint local_114;
  UpdateObjectMapsFrame local_110;
  __uniq_ptr_impl<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> local_f0;
  QPDFObjectHandle local_e8;
  vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_> local_d8;
  function<int_(QPDFObjectHandle_&)> *local_b8;
  QPDF *local_b0;
  string local_a8;
  _Base_ptr local_88;
  string local_80;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.
  super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110.ou._0_1_ = 1;
  local_b8 = skip_stream_parameters;
  local_b0 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>::
  emplace_back<QPDF::ObjUser_const&,QPDFObjectHandle&,bool>
            ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>> *)
             &local_d8,first_ou,first_oh,(bool *)&local_110);
  local_f0._M_t.super__Tuple_impl<0UL,_QPDF::ObjUser_*,_std::default_delete<QPDF::ObjUser>_>.
  super__Head_base<0UL,_QPDF::ObjUser_*,_false>._M_head_impl =
       (tuple<QPDF::ObjUser_*,_std::default_delete<QPDF::ObjUser>_>)
       (_Tuple_impl<0UL,_QPDF::ObjUser_*,_std::default_delete<QPDF::ObjUser>_>)0x0;
  do {
    this_02 = &local_110.oh;
    if (local_d8.
        super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_d8.
        super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_>::~unique_ptr
                ((unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> *)&local_f0);
      std::vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>::
      ~vector(&local_d8);
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    UpdateObjectMapsFrame::UpdateObjectMapsFrame
              (&local_110,
               local_d8.
               super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    pUVar1 = local_d8.
             super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_d8.
    super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_d8.
         super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(pUVar1->oh).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"/Page",(allocator<char> *)&local_e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"",(allocator<char> *)&local_114);
    bVar2 = QPDFObjectHandle::isDictionaryOfType(this_02,&local_a8,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a8);
    if ((!bVar2) || (local_110.top != false)) {
      bVar3 = QPDFObjectHandle::isIndirect(this_02);
      if (bVar3) {
        local_a8._M_dataplus._M_p = (pointer)QPDFObjectHandle::getObjGen(this_02);
        bVar3 = QPDFObjGen::set::add((set *)&local_60,(QPDFObjGen)local_a8._M_dataplus._M_p);
        if (!bVar3) goto LAB_001ed333;
        this_00 = (_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                   *)std::
                     map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                     ::operator[](&((local_b0->m)._M_t.
                                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                    .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                   obj_user_to_objects,
                                  (key_type *)CONCAT71(local_110.ou._1_7_,local_110.ou._0_1_));
        std::
        _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
        ::_M_insert_unique<QPDFObjGen_const&>(this_00,(QPDFObjGen *)&local_a8);
        this_01 = (_Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
                   *)std::
                     map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                     ::operator[](&((local_b0->m)._M_t.
                                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                    .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                   object_to_obj_users,(key_type *)&local_a8);
        std::
        _Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
        ::_M_insert_unique<QPDF::ObjUser_const&>
                  (this_01,(ObjUser *)CONCAT71(local_110.ou._1_7_,local_110.ou._0_1_));
      }
      bVar3 = QPDFObjectHandle::isArray(this_02);
      if (bVar3) {
        ::qpdf::Array::Array((Array *)&local_a8,(shared_ptr<QPDFObject> *)this_02);
        __args_1 = ::qpdf::Array::begin((Array *)&local_a8);
        iVar5 = ::qpdf::Array::end((Array *)&local_a8);
        for (; __args_1._M_current != iVar5._M_current;
            __args_1._M_current = __args_1._M_current + 1) {
          local_80._M_dataplus._M_p._0_1_ = 0;
          std::vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>::
          emplace_back<QPDF::ObjUser_const&,QPDFObjectHandle_const&,bool>
                    ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                      *)&local_d8,(ObjUser *)CONCAT71(local_110.ou._1_7_,local_110.ou._0_1_),
                     __args_1._M_current,(bool *)&local_80);
        }
        ::qpdf::Array::~Array((Array *)&local_a8);
      }
      else {
        bVar3 = QPDFObjectHandle::isDictionary(this_02);
        if ((bVar3) || (bVar3 = QPDFObjectHandle::isStream(this_02), bVar3)) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this_02);
          bVar3 = QPDFObjectHandle::isStream(this_02);
          iVar4 = 0;
          if (bVar3) {
            QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_80);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_80);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
            iVar4 = 0;
            if ((local_b8->super__Function_base)._M_manager != (_Manager_type)0x0) {
              iVar4 = std::function<int_(QPDFObjectHandle_&)>::operator()(local_b8,this_02);
            }
          }
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_80,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
          iVar6 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_80);
          iVar7 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_80);
          local_88 = iVar7._M_node;
          for (; iVar6._M_node != iVar7._M_node;
              iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node)) {
            bVar3 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar6._M_node + 2));
            if (!bVar3) {
              __lhs = iVar6._M_node + 1;
              if (bVar2) {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"/Thumb");
                if (bVar3) {
                  local_114 = 2;
                  std::make_unique<QPDF::ObjUser,QPDF::ObjUser::user_e,int_const&>
                            ((user_e *)&local_e8,(int *)&local_114);
                  __p = local_e8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  local_e8.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  std::__uniq_ptr_impl<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_>::reset
                            (&local_f0,(pointer)__p);
                  std::unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_>::~unique_ptr
                            ((unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> *)
                             &local_e8);
                  __args._M_t.
                  super__Tuple_impl<0UL,_QPDF::ObjUser_*,_std::default_delete<QPDF::ObjUser>_>.
                  super__Head_base<0UL,_QPDF::ObjUser_*,_false>._M_head_impl =
                       local_f0._M_t.
                       super__Tuple_impl<0UL,_QPDF::ObjUser_*,_std::default_delete<QPDF::ObjUser>_>.
                       super__Head_base<0UL,_QPDF::ObjUser_*,_false>._M_head_impl;
                  QPDFObjectHandle::getKey(&local_e8,&local_a8);
                  local_114 = local_114 & 0xffffff00;
                  std::
                  vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>::
                  emplace_back<QPDF::ObjUser&,QPDFObjectHandle,bool>
                            ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                              *)&local_d8,
                             (ObjUser *)
                             __args._M_t.
                             super__Tuple_impl<0UL,_QPDF::ObjUser_*,_std::default_delete<QPDF::ObjUser>_>
                             .super__Head_base<0UL,_QPDF::ObjUser_*,_false>._M_head_impl,&local_e8,
                             (bool *)&local_114);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_e8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
                  iVar7._M_node = local_88;
                }
                else {
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"/Parent");
                  if (!bVar3) goto LAB_001ed287;
                }
              }
              else {
LAB_001ed287:
                if ((iVar4 < 1) ||
                   ((bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)__lhs,"/Length"), !bVar3 &&
                    ((iVar4 == 1 ||
                     ((bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)__lhs,"/Filter"), !bVar3 &&
                      (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)__lhs,"/DecodeParms"), !bVar3)))))))) {
                  local_e8.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)
                       ((ulong)local_e8.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
                       0xffffffffffffff00);
                  std::
                  vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>::
                  emplace_back<QPDF::ObjUser_const&,QPDFObjectHandle&,bool>
                            ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                              *)&local_d8,(ObjUser *)CONCAT71(local_110.ou._1_7_,local_110.ou._0_1_)
                             ,(QPDFObjectHandle *)(iVar6._M_node + 2),(bool *)&local_e8);
                }
              }
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
        }
      }
    }
LAB_001ed333:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_110.oh.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  } while( true );
}

Assistant:

void
QPDF::updateObjectMaps(
    ObjUser const& first_ou,
    QPDFObjectHandle first_oh,
    std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
{
    QPDFObjGen::set visited;
    std::vector<UpdateObjectMapsFrame> pending;
    pending.emplace_back(first_ou, first_oh, true);
    // Traverse the object tree from this point taking care to avoid crossing page boundaries.
    std::unique_ptr<ObjUser> thumb_ou;
    while (!pending.empty()) {
        auto cur = pending.back();
        pending.pop_back();

        bool is_page_node = false;

        if (cur.oh.isDictionaryOfType("/Page")) {
            is_page_node = true;
            if (!cur.top) {
                continue;
            }
        }

        if (cur.oh.isIndirect()) {
            QPDFObjGen og(cur.oh.getObjGen());
            if (!visited.add(og)) {
                QTC::TC("qpdf", "QPDF opt loop detected");
                continue;
            }
            m->obj_user_to_objects[cur.ou].insert(og);
            m->object_to_obj_users[og].insert(cur.ou);
        }

        if (cur.oh.isArray()) {
            for (auto const& item: cur.oh.as_array()) {
                pending.emplace_back(cur.ou, item, false);
            }
        } else if (cur.oh.isDictionary() || cur.oh.isStream()) {
            QPDFObjectHandle dict = cur.oh;
            bool is_stream = cur.oh.isStream();
            int ssp = 0;
            if (is_stream) {
                dict = cur.oh.getDict();
                if (skip_stream_parameters) {
                    ssp = skip_stream_parameters(cur.oh);
                }
            }

            for (auto& [key, value]: dict.as_dictionary()) {
                if (value.null()) {
                    continue;
                }

                if (is_page_node && (key == "/Thumb")) {
                    // Traverse page thumbnail dictionaries as a special case. There can only ever
                    // be one /Thumb key on a page, and we see at most one page node per call.
                    thumb_ou = std::make_unique<ObjUser>(ObjUser::ou_thumb, cur.ou.pageno);
                    pending.emplace_back(*thumb_ou, dict.getKey(key), false);
                } else if (is_page_node && (key == "/Parent")) {
                    // Don't traverse back up the page tree
                } else if (
                    ((ssp >= 1) && (key == "/Length")) ||
                    ((ssp >= 2) && ((key == "/Filter") || (key == "/DecodeParms")))) {
                    // Don't traverse into stream parameters that we are not going to write.
                } else {
                    pending.emplace_back(cur.ou, value, false);
                }
            }
        }
    }
}